

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_initialize_test.cpp
# Opt level: O3

void __thiscall
metacall_initialize_test_DefaultConstructor_Test::TestBody
          (metacall_initialize_test_DefaultConstructor_Test *this)

{
  internal iVar1;
  undefined8 *puVar2;
  char *pcVar3;
  char *mock_scripts [1];
  AssertionResult gtest_ar;
  AssertHelper local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  undefined8 *local_20;
  
  metacall_print_info();
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_38._M_head_impl._4_4_ << 0x20);
  local_40.data_._0_4_ = metacall_initialize();
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"(int)0","(int)metacall_initialize()",(int *)&local_38,(int *)&local_40);
  iVar1 = local_28[0];
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_initialize_test/source/metacall_initialize_test.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  puVar2 = local_20;
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(puVar2);
  }
  if (iVar1 != (internal)0x0) {
    local_38._M_head_impl._0_4_ = 1;
    local_40.data_._0_4_ = metacall_is_initialized("mock");
    testing::internal::CmpHelperEQ<int,int>
              (local_28,"(int)1","(int)metacall_is_initialized(\"mock\")",(int *)&local_38,
               (int *)&local_40);
    iVar1 = local_28[0];
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_20 == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (char *)*local_20;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_initialize_test/source/metacall_initialize_test.cpp"
                 ,0x25,pcVar3);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    puVar2 = local_20;
    if (local_20 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_20 != local_20 + 2) {
        operator_delete((undefined8 *)*local_20);
      }
      operator_delete(puVar2);
    }
    if (iVar1 != (internal)0x0) {
      local_38._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13610a;
      local_40.data_._0_4_ = 0;
      local_30.data_._0_4_ = metacall_load_from_file("mock",&local_38,1,0);
      testing::internal::CmpHelperEQ<int,int>
                (local_28,"(int)0",
                 "(int)metacall_load_from_file(\"mock\", mock_scripts, sizeof(mock_scripts) / sizeof(mock_scripts[0]), __null)"
                 ,(int *)&local_40,(int *)&local_30);
      if (local_28[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (local_20 == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (char *)*local_20;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_initialize_test/source/metacall_initialize_test.cpp"
                   ,0x2e,pcVar3);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if ((long *)CONCAT44(local_40.data_._4_4_,local_40.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_40.data_._4_4_,local_40.data_._0_4_) + 8))();
        }
      }
      puVar2 = local_20;
      if (local_20 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_20 != local_20 + 2) {
          operator_delete((undefined8 *)*local_20);
        }
        operator_delete(puVar2);
      }
      local_40.data_._0_4_ = 0;
      local_30.data_._0_4_ = metacall_is_initialized("mock");
      testing::internal::CmpHelperEQ<int,int>
                (local_28,"(int)0","(int)metacall_is_initialized(\"mock\")",(int *)&local_40,
                 (int *)&local_30);
      if (local_28[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (local_20 == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (char *)*local_20;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_initialize_test/source/metacall_initialize_test.cpp"
                   ,0x30,pcVar3);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if ((long *)CONCAT44(local_40.data_._4_4_,local_40.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_40.data_._4_4_,local_40.data_._0_4_) + 8))();
        }
      }
      if (local_20 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_20 != local_20 + 2) {
          operator_delete((undefined8 *)*local_20);
        }
        operator_delete(local_20);
      }
      if (local_28[0] != (internal)0x0) {
        metacall_destroy();
      }
    }
  }
  return;
}

Assistant:

TEST_F(metacall_initialize_test, DefaultConstructor)
{
	metacall_print_info();

	ASSERT_EQ((int)0, (int)metacall_initialize());

	ASSERT_EQ((int)1, (int)metacall_is_initialized("mock"));

/* Mock */
#if defined(OPTION_BUILD_LOADERS_MOCK)
	{
		const char *mock_scripts[] = {
			"empty.mock"
		};

		EXPECT_EQ((int)0, (int)metacall_load_from_file("mock", mock_scripts, sizeof(mock_scripts) / sizeof(mock_scripts[0]), NULL));

		ASSERT_EQ((int)0, (int)metacall_is_initialized("mock"));
	}
#endif /* OPTION_BUILD_LOADERS_MOCK */

	metacall_destroy();
}